

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergeometric_dist.hpp
# Opt level: O0

double __thiscall trng::hypergeometric_dist::pdf(hypergeometric_dist *this,int x)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  int in_ESI;
  long in_RDI;
  undefined8 local_8;
  
  if ((in_ESI < *(int *)(in_RDI + 0xc)) || (*(int *)(in_RDI + 0x10) < in_ESI)) {
    local_8 = 0.0;
  }
  else {
    iVar2 = in_ESI - *(int *)(in_RDI + 0xc);
    if (iVar2 == 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),0);
      local_8 = *pvVar3;
    }
    else {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),(long)iVar2);
      dVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x18),
                          (long)(iVar2 + -1));
      local_8 = dVar1 - *pvVar3;
    }
  }
  return local_8;
}

Assistant:

double pdf(int x) const {
      if (x < P.x_min or x > P.x_max)
        return 0.0;
      x -= P.x_min;
      if (x == 0)
        return P.P_[0];
      return P.P_[x] - P.P_[x - 1];
    }